

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_BookE206(CPUPPCState_conflict2 *env,uint32_t mas_mask,uint32_t *tlbncfg,uint32_t mmucfg
                     )

{
  int iVar1;
  uint uVar2;
  ppc_spr_t *ppVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  lVar8 = 0;
  lVar6 = 0;
  do {
    pcVar5 = spr_write_generic32;
    if ((lVar6 == 2 && (mas_mask & 4) != 0) &&
       (pcVar5 = spr_write_generic, (env->insns_flags & 0x20) == 0)) {
      pcVar5 = spr_write_generic32;
    }
    if ((mas_mask >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      lVar4 = (long)(int)*(uint *)((long)&DAT_00dafb00 + lVar8);
      if ((((env->spr_cb[lVar4].name != (char *)0x0) || (env->spr[lVar4] != 0)) ||
          (ppVar3 = env->spr_cb + lVar4,
          ppVar3->oea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
         (((ppVar3->oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
           (ppVar3->uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
          (ppVar3->uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        uVar7 = (ulong)*(uint *)((long)&DAT_00dafb00 + lVar8);
        goto LAB_00b6b9ac;
      }
      ppVar3->name = (char *)((long)&DAT_00db55d0 + (long)*(int *)((long)&DAT_00db55d0 + lVar8));
      ppVar3->uea_read = spr_noaccess;
      ppVar3->uea_write = spr_noaccess;
      ppVar3->oea_read = spr_read_generic;
      ppVar3->oea_write = pcVar5;
      ppVar3->hea_read = spr_read_generic;
      ppVar3->hea_write = pcVar5;
      ppVar3->default_value = 0;
      env->spr[lVar4] = 0;
    }
    lVar6 = lVar6 + 1;
    lVar8 = lVar8 + 4;
  } while (lVar6 != 8);
  iVar1 = env->nb_pids;
  if (1 < iVar1) {
    if (((env->spr_cb[0x279].name != (char *)0x0) || (env->spr[0x279] != 0)) ||
       ((env->spr_cb[0x279].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0 ||
        (((env->spr_cb[0x279].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
          (env->spr_cb[0x279].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
         (env->spr_cb[0x279].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      uVar7 = 0x279;
      lVar4 = 0x279;
      goto LAB_00b6b9ac;
    }
    env->spr_cb[0x279].name = "PID1";
    env->spr_cb[0x279].uea_read = spr_noaccess;
    env->spr_cb[0x279].uea_write = spr_noaccess;
    env->spr_cb[0x279].oea_read = spr_read_generic;
    env->spr_cb[0x279].oea_write = spr_write_booke_pid;
    env->spr_cb[0x279].hea_read = spr_read_generic;
    env->spr_cb[0x279].hea_write = spr_write_booke_pid;
    env->spr_cb[0x279].default_value = 0;
    env->spr[0x279] = 0;
    if (iVar1 != 2) {
      if (((env->spr_cb[0x27a].name != (char *)0x0) || (env->spr[0x27a] != 0)) ||
         (((env->spr_cb[0x27a].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0 ||
           ((env->spr_cb[0x27a].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
            (env->spr_cb[0x27a].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)))) ||
          (env->spr_cb[0x27a].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        uVar7 = 0x27a;
        lVar4 = 0x27a;
        goto LAB_00b6b9ac;
      }
      env->spr_cb[0x27a].name = "PID2";
      env->spr_cb[0x27a].uea_read = spr_noaccess;
      env->spr_cb[0x27a].uea_write = spr_noaccess;
      env->spr_cb[0x27a].oea_read = spr_read_generic;
      env->spr_cb[0x27a].oea_write = spr_write_booke_pid;
      env->spr_cb[0x27a].hea_read = spr_read_generic;
      env->spr_cb[0x27a].hea_write = spr_write_booke_pid;
      env->spr_cb[0x27a].default_value = 0;
      env->spr[0x27a] = 0;
    }
  }
  if (((((env->spr_cb[0x3b3].name != (char *)0x0) || (env->spr[0x3b3] != 0)) ||
       (env->spr_cb[0x3b3].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
      ((env->spr_cb[0x3b3].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
       (env->spr_cb[0x3b3].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)))) ||
     (env->spr_cb[0x3b3].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)) {
    uVar7 = 0x3b3;
    lVar4 = 0x3b3;
    goto LAB_00b6b9ac;
  }
  env->spr_cb[0x3b3].name = "EPLC";
  env->spr_cb[0x3b3].uea_read = spr_noaccess;
  env->spr_cb[0x3b3].uea_write = spr_noaccess;
  env->spr_cb[0x3b3].oea_read = spr_read_generic;
  env->spr_cb[0x3b3].oea_write = spr_write_eplc;
  env->spr_cb[0x3b3].hea_read = spr_read_generic;
  env->spr_cb[0x3b3].hea_write = spr_write_eplc;
  env->spr_cb[0x3b3].default_value = 0;
  env->spr[0x3b3] = 0;
  if (((env->spr_cb[0x3b4].name != (char *)0x0) || (env->spr[0x3b4] != 0)) ||
     ((env->spr_cb[0x3b4].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0 ||
      (((env->spr_cb[0x3b4].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
        (env->spr_cb[0x3b4].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
       (env->spr_cb[0x3b4].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
    uVar7 = 0x3b4;
    lVar4 = 0x3b4;
    goto LAB_00b6b9ac;
  }
  env->spr_cb[0x3b4].name = "EPSC";
  env->spr_cb[0x3b4].uea_read = spr_noaccess;
  env->spr_cb[0x3b4].uea_write = spr_noaccess;
  env->spr_cb[0x3b4].oea_read = spr_read_generic;
  env->spr_cb[0x3b4].oea_write = spr_write_epsc;
  env->spr_cb[0x3b4].hea_read = spr_read_generic;
  env->spr_cb[0x3b4].hea_write = spr_write_epsc;
  env->spr_cb[0x3b4].default_value = 0;
  env->spr[0x3b4] = 0;
  if ((((env->spr_cb[0x3f7].name != (char *)0x0) || (env->spr[0x3f7] != 0)) ||
      ((env->spr_cb[0x3f7].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0 ||
       ((env->spr_cb[0x3f7].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
        (env->spr_cb[0x3f7].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)))))) ||
     (env->spr_cb[0x3f7].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)) {
    uVar7 = 0x3f7;
    lVar4 = 0x3f7;
    goto LAB_00b6b9ac;
  }
  env->spr_cb[0x3f7].name = "MMUCFG";
  env->spr_cb[0x3f7].uea_read = spr_noaccess;
  env->spr_cb[0x3f7].uea_write = spr_noaccess;
  env->spr_cb[0x3f7].oea_read = spr_read_generic;
  env->spr_cb[0x3f7].oea_write = spr_noaccess;
  env->spr_cb[0x3f7].hea_read = spr_read_generic;
  env->spr_cb[0x3f7].hea_write = spr_noaccess;
  env->spr_cb[0x3f7].default_value = (ulong)mmucfg;
  env->spr[0x3f7] = (ulong)mmucfg;
  switch(env->nb_ways) {
  case 1:
    goto switchD_00b6b6ff_caseD_1;
  case 2:
    goto switchD_00b6b6ff_caseD_2;
  case 3:
    break;
  case 4:
    if ((((env->spr_cb[0x2b3].name != (char *)0x0) || (env->spr[0x2b3] != 0)) ||
        (env->spr_cb[0x2b3].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
       (((env->spr_cb[0x2b3].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
         (env->spr_cb[0x2b3].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
        (env->spr_cb[0x2b3].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))) {
      uVar7 = 0x2b3;
      lVar4 = 0x2b3;
      goto LAB_00b6b9ac;
    }
    uVar2 = tlbncfg[3];
    env->spr_cb[0x2b3].name = "TLB3CFG";
    env->spr_cb[0x2b3].uea_read = spr_noaccess;
    env->spr_cb[0x2b3].uea_write = spr_noaccess;
    env->spr_cb[0x2b3].oea_read = spr_read_generic;
    env->spr_cb[0x2b3].oea_write = spr_noaccess;
    env->spr_cb[0x2b3].hea_read = spr_read_generic;
    env->spr_cb[0x2b3].hea_write = spr_noaccess;
    env->spr_cb[0x2b3].default_value = (ulong)uVar2;
    env->spr[0x2b3] = (ulong)uVar2;
    break;
  default:
    goto switchD_00b6b6ff_default;
  }
  if (((env->spr_cb[0x2b2].name == (char *)0x0) && (env->spr[0x2b2] == 0)) &&
     ((env->spr_cb[0x2b2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
      (((env->spr_cb[0x2b2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (env->spr_cb[0x2b2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
       (env->spr_cb[0x2b2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
    uVar2 = tlbncfg[2];
    env->spr_cb[0x2b2].name = "TLB2CFG";
    env->spr_cb[0x2b2].uea_read = spr_noaccess;
    env->spr_cb[0x2b2].uea_write = spr_noaccess;
    env->spr_cb[0x2b2].oea_read = spr_read_generic;
    env->spr_cb[0x2b2].oea_write = spr_noaccess;
    env->spr_cb[0x2b2].hea_read = spr_read_generic;
    env->spr_cb[0x2b2].hea_write = spr_noaccess;
    env->spr_cb[0x2b2].default_value = (ulong)uVar2;
    env->spr[0x2b2] = (ulong)uVar2;
switchD_00b6b6ff_caseD_2:
    if (((env->spr_cb[0x2b1].name == (char *)0x0) && (env->spr[0x2b1] == 0)) &&
       (((env->spr_cb[0x2b1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
         ((env->spr_cb[0x2b1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x2b1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
        (env->spr_cb[0x2b1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
      uVar2 = tlbncfg[1];
      env->spr_cb[0x2b1].name = "TLB1CFG";
      env->spr_cb[0x2b1].uea_read = spr_noaccess;
      env->spr_cb[0x2b1].uea_write = spr_noaccess;
      env->spr_cb[0x2b1].oea_read = spr_read_generic;
      env->spr_cb[0x2b1].oea_write = spr_noaccess;
      env->spr_cb[0x2b1].hea_read = spr_read_generic;
      env->spr_cb[0x2b1].hea_write = spr_noaccess;
      env->spr_cb[0x2b1].default_value = (ulong)uVar2;
      env->spr[0x2b1] = (ulong)uVar2;
switchD_00b6b6ff_caseD_1:
      if (((((env->spr_cb[0x2b0].name == (char *)0x0) && (env->spr[0x2b0] == 0)) &&
           (env->spr_cb[0x2b0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
          ((env->spr_cb[0x2b0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           (env->spr_cb[0x2b0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
         (env->spr_cb[0x2b0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        uVar2 = *tlbncfg;
        env->spr_cb[0x2b0].name = "TLB0CFG";
        env->spr_cb[0x2b0].uea_read = spr_noaccess;
        env->spr_cb[0x2b0].uea_write = spr_noaccess;
        env->spr_cb[0x2b0].oea_read = spr_read_generic;
        env->spr_cb[0x2b0].oea_write = spr_noaccess;
        env->spr_cb[0x2b0].hea_read = spr_read_generic;
        env->spr_cb[0x2b0].hea_write = spr_noaccess;
        env->spr_cb[0x2b0].default_value = (ulong)uVar2;
        env->spr[0x2b0] = (ulong)uVar2;
switchD_00b6b6ff_default:
        gen_spr_usprgh(env);
        return;
      }
      uVar7 = 0x2b0;
      lVar4 = 0x2b0;
    }
    else {
      uVar7 = 0x2b1;
      lVar4 = 0x2b1;
    }
  }
  else {
    uVar7 = 0x2b2;
    lVar4 = 0x2b2;
  }
LAB_00b6b9ac:
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar7,lVar4);
  exit(1);
}

Assistant:

static void gen_spr_BookE206(CPUPPCState *env, uint32_t mas_mask,
                             uint32_t *tlbncfg, uint32_t mmucfg)
{
    const char *mas_names[8] = {
        "MAS0", "MAS1", "MAS2", "MAS3", "MAS4", "MAS5", "MAS6", "MAS7",
    };
    int mas_sprn[8] = {
        SPR_BOOKE_MAS0, SPR_BOOKE_MAS1, SPR_BOOKE_MAS2, SPR_BOOKE_MAS3,
        SPR_BOOKE_MAS4, SPR_BOOKE_MAS5, SPR_BOOKE_MAS6, SPR_BOOKE_MAS7,
    };
    int i;

    /* TLB assist registers */
    /* XXX : not implemented */
    for (i = 0; i < 8; i++) {
        void (*uea_write)(DisasContext *ctx, int sprn, int gprn) =
            &spr_write_generic32;
        if (i == 2 && (mas_mask & (1 << i)) && (env->insns_flags & PPC_64B)) {
            uea_write = &spr_write_generic;
        }
        if (mas_mask & (1 << i)) {
            spr_register(env, mas_sprn[i], mas_names[i],
                         SPR_NOACCESS, SPR_NOACCESS,
                         &spr_read_generic, uea_write,
                         0x00000000);
        }
    }
    if (env->nb_pids > 1) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID1, "PID1",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }
    if (env->nb_pids > 2) {
        /* XXX : not implemented */
        spr_register(env, SPR_BOOKE_PID2, "PID2",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_booke_pid,
                     0x00000000);
    }

    spr_register(env, SPR_BOOKE_EPLC, "EPLC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_eplc,
                 0x00000000);
    spr_register(env, SPR_BOOKE_EPSC, "EPSC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_epsc,
                 0x00000000);

    /* XXX : not implemented */
    spr_register(env, SPR_MMUCFG, "MMUCFG",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 mmucfg);
    switch (env->nb_ways) {
    case 4:
        spr_register(env, SPR_BOOKE_TLB3CFG, "TLB3CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[3]);
        /* Fallthru */
    case 3:
        spr_register(env, SPR_BOOKE_TLB2CFG, "TLB2CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[2]);
        /* Fallthru */
    case 2:
        spr_register(env, SPR_BOOKE_TLB1CFG, "TLB1CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[1]);
        /* Fallthru */
    case 1:
        spr_register(env, SPR_BOOKE_TLB0CFG, "TLB0CFG",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, SPR_NOACCESS,
                     tlbncfg[0]);
        /* Fallthru */
    case 0:
    default:
        break;
    }

    gen_spr_usprgh(env);
}